

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

void __thiscall
mjs::gc_type_info::gc_type_info
          (gc_type_info *this,destroy_function destroy,move_function move,fixup_function fixup,
          bool convertible_to_object,char *name)

{
  int iVar1;
  char *name_local;
  bool convertible_to_object_local;
  fixup_function fixup_local;
  move_function move_local;
  destroy_function destroy_local;
  gc_type_info *this_local;
  
  this->destroy_ = destroy;
  this->move_ = move;
  this->fixup_ = fixup;
  this->convertible_to_object_ = convertible_to_object;
  this->name_ = name;
  iVar1 = num_types_ + 1;
  this->index_ = num_types_;
  num_types_ = iVar1;
  if (0x3f < this->index_) {
    __assert_fail("index_ < max_types",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x55,
                  "mjs::gc_type_info::gc_type_info(destroy_function, move_function, fixup_function, bool, const char *)"
                 );
  }
  *(gc_type_info **)(types_ + (ulong)this->index_ * 8) = this;
  if (this->move_ != (move_function)0x0) {
    if (this->name_ != (char *)0x0) {
      return;
    }
    __assert_fail("name_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x58,
                  "mjs::gc_type_info::gc_type_info(destroy_function, move_function, fixup_function, bool, const char *)"
                 );
  }
  __assert_fail("move_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x57,
                "mjs::gc_type_info::gc_type_info(destroy_function, move_function, fixup_function, bool, const char *)"
               );
}

Assistant:

explicit gc_type_info(destroy_function destroy, move_function move, fixup_function fixup, bool convertible_to_object, const char* name)
        : destroy_(destroy)
        , move_(move)
        , fixup_(fixup)
        , convertible_to_object_(convertible_to_object)
        , name_(name)
        , index_(num_types_++) {

        assert(index_ < max_types);
        types_[index_] = this;
        assert(move_);
        assert(name_);
    }